

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O3

bool __thiscall wallet::BerkeleyRODatabase::Backup(BerkeleyRODatabase *this,string *dest)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _List _Var3;
  _List _Var4;
  char cVar5;
  bool bVar6;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  path dst;
  path src;
  path local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::filesystem::__cxx11::path::path(&src.super_path,&(this->m_filepath).super_path);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_60,dest,auto_format);
  std::filesystem::__cxx11::path::path(&dst.super_path,&local_60);
  std::filesystem::__cxx11::path::~path(&local_60);
  cVar5 = std::filesystem::status(&dst.super_path);
  if (cVar5 == '\x02') {
    BDBDataFile((path *)&local_60,&dst);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dst,
               &local_60._M_pathname);
    _Var4._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         local_60._M_cmpts._M_impl._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    _Var3 = dst.super_path._M_cmpts;
    local_60._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
            )0x0;
    dst.super_path._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )_Var4;
    if (_Var3._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl
        != (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
            )0x0) {
      std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                ((_Impl_deleter *)&dst.super_path._M_cmpts,
                 (_Impl *)_Var3._M_impl._M_t.
                          super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                          .
                          super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                          ._M_head_impl);
    }
    std::filesystem::__cxx11::path::clear(&local_60);
    std::filesystem::__cxx11::path::~path(&local_60);
  }
  cVar5 = std::filesystem::status(&dst.super_path);
  if ((cVar5 != '\0') && (cVar5 != -1)) {
    cVar5 = std::filesystem::equivalent(&src.super_path,&dst.super_path);
    if (cVar5 != '\0') {
      paVar1 = &local_60._M_pathname.field_2;
      local_60._M_pathname._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,dst.super_path._M_pathname._M_dataplus._M_p,
                 dst.super_path._M_pathname._M_dataplus._M_p +
                 dst.super_path._M_pathname._M_string_length);
      logging_function._M_str = "Backup";
      logging_function._M_len = 6;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/migrate.cpp"
      ;
      source_file._M_len = 0x62;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,0x2cd,ALL,Info,(ConstevalFormatString<1U>)0x836389,
                 &local_60._M_pathname);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_pathname._M_dataplus._M_p,
                        local_60._M_pathname.field_2._M_allocated_capacity + 1);
      }
      bVar6 = false;
      goto LAB_00568dbb;
    }
  }
  std::filesystem::copy_file(&src.super_path,&dst.super_path,overwrite_existing);
  pcVar2 = (this->m_filepath).super_path._M_pathname._M_dataplus._M_p;
  paVar1 = &local_60._M_pathname.field_2;
  local_60._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,pcVar2,
             pcVar2 + (this->m_filepath).super_path._M_pathname._M_string_length);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,dst.super_path._M_pathname._M_dataplus._M_p,
             dst.super_path._M_pathname._M_dataplus._M_p +
             dst.super_path._M_pathname._M_string_length);
  logging_function_00._M_str = "Backup";
  logging_function_00._M_len = 6;
  source_file_00._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/migrate.cpp"
  ;
  source_file_00._M_len = 0x62;
  LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
            (logging_function_00,source_file_00,0x2d2,ALL,Info,(ConstevalFormatString<2U>)0x8363b1,
             &local_60._M_pathname,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_pathname._M_dataplus._M_p,
                    local_60._M_pathname.field_2._M_allocated_capacity + 1);
  }
  bVar6 = true;
LAB_00568dbb:
  std::filesystem::__cxx11::path::~path(&dst.super_path);
  std::filesystem::__cxx11::path::~path(&src.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool BerkeleyRODatabase::Backup(const std::string& dest) const
{
    fs::path src(m_filepath);
    fs::path dst(fs::PathFromString(dest));

    if (fs::is_directory(dst)) {
        dst = BDBDataFile(dst);
    }
    try {
        if (fs::exists(dst) && fs::equivalent(src, dst)) {
            LogPrintf("cannot backup to wallet source file %s\n", fs::PathToString(dst));
            return false;
        }

        fs::copy_file(src, dst, fs::copy_options::overwrite_existing);
        LogPrintf("copied %s to %s\n", fs::PathToString(m_filepath), fs::PathToString(dst));
        return true;
    } catch (const fs::filesystem_error& e) {
        LogPrintf("error copying %s to %s - %s\n", fs::PathToString(m_filepath), fs::PathToString(dst), fsbridge::get_filesystem_error_message(e));
        return false;
    }
}